

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
spirv_cross::SPIRAccessChain::SPIRAccessChain
          (SPIRAccessChain *this,TypeID basetype_,StorageClass storage_,string *base_,
          string *dynamic_index_,int32_t static_index_)

{
  int32_t static_index__local;
  string *dynamic_index__local;
  string *base__local;
  StorageClass storage__local;
  SPIRAccessChain *this_local;
  TypeID basetype__local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_00502198;
  *(uint32_t *)&(this->super_IVariant).field_0xc = basetype_.id;
  this->storage = storage_;
  ::std::__cxx11::string::string((string *)&this->base,(string *)base_);
  ::std::__cxx11::string::string((string *)&this->dynamic_index,(string *)dynamic_index_);
  this->static_index = static_index_;
  TypedID<(spirv_cross::Types)2>::TypedID(&this->loaded_from,0);
  this->matrix_stride = 0;
  this->array_stride = 0;
  this->row_major_matrix = false;
  this->immutable = false;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::SmallVector
            (&this->implied_read_expressions);
  return;
}

Assistant:

SPIRAccessChain(TypeID basetype_, spv::StorageClass storage_, std::string base_, std::string dynamic_index_,
	                int32_t static_index_)
	    : basetype(basetype_)
	    , storage(storage_)
	    , base(std::move(base_))
	    , dynamic_index(std::move(dynamic_index_))
	    , static_index(static_index_)
	{
	}